

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qo_manager.cc
# Opt level: O2

RC __thiscall
QO_Manager::ApplyLTCond
          (QO_Manager *this,
          map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
          *attr_stats,int condIdx,float *numTuples)

{
  undefined1 auVar1 [16];
  RC RVar2;
  mapped_type *pmVar3;
  mapped_type *pmVar4;
  QO_Manager *pQVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  undefined1 auVar9 [16];
  int idx;
  int idx2;
  float value;
  float local_98;
  float fStack_94;
  int local_80;
  int local_7c;
  undefined1 local_78 [8];
  float fStack_70;
  float fStack_6c;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [20];
  float local_34;
  
  RVar2 = CondToAttrIdx(this,condIdx,&local_80,&local_7c);
  if (RVar2 == 0) {
    pQVar5 = (QO_Manager *)attr_stats;
    if (this->conds[condIdx].bRhsIsAttr == 0) {
      ConvertValueToFloat(this,condIdx,&local_34);
      local_68 = ZEXT416((uint)local_34);
      pmVar3 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](attr_stats,&local_80);
      fVar6 = pmVar3->minValue;
      pmVar3 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](attr_stats,&local_80);
      local_58 = ZEXT416((uint)pmVar3->maxValue);
      pmVar3 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](attr_stats,&local_80);
      fVar7 = (((float)local_68._0_4_ - fVar6) + 1.0) /
              (((float)local_58._0_4_ - pmVar3->minValue) + 2.0);
      *numTuples = *numTuples * fVar7;
      pmVar3 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](attr_stats,&local_80);
      fVar6 = pmVar3->numTuples;
      pmVar3 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](attr_stats,&local_80);
      pmVar3->numTuples = fVar7 * fVar6;
      pmVar3 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](attr_stats,&local_80);
      pmVar3->maxValue = (float)local_68._0_4_;
      fVar6 = (float)local_68._0_4_;
    }
    else {
      pmVar3 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](attr_stats,&local_80);
      pmVar4 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](attr_stats,&local_7c);
      fVar6 = pmVar4->maxValue;
      if (pmVar3->maxValue <= pmVar4->maxValue) {
        fVar6 = pmVar3->maxValue;
      }
      pmVar3 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](attr_stats,&local_80);
      pmVar4 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](attr_stats,&local_7c);
      fVar7 = pmVar4->minValue;
      if (pmVar4->minValue <= pmVar3->minValue) {
        fVar7 = pmVar3->minValue;
      }
      fVar6 = (fVar7 + fVar6) * 0.5;
      pmVar3 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](attr_stats,&local_7c);
      local_68 = ZEXT416((uint)pmVar3->maxValue);
      pmVar3 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](attr_stats,&local_7c);
      _local_78 = ZEXT416((uint)pmVar3->maxValue);
      pmVar3 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](attr_stats,&local_7c);
      local_58 = ZEXT416((uint)pmVar3->minValue);
      pmVar3 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](attr_stats,&local_80);
      local_48._0_16_ = ZEXT416((uint)pmVar3->minValue);
      pmVar3 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](attr_stats,&local_80);
      fStack_6c = (float)local_78._4_4_;
      local_78._4_4_ = local_78._0_4_;
      local_78._0_4_ = pmVar3->maxValue;
      fStack_70 = 0.0;
      pmVar3 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](attr_stats,&local_80);
      auVar9._4_4_ = ((float)local_68._0_4_ - fVar6) + 1.0;
      auVar9._0_4_ = (fVar6 - (float)local_48._0_4_) + 1.0;
      auVar9._8_4_ = (0.0 - (float)local_48._4_4_) + 0.0;
      auVar9._12_4_ = ((float)local_68._4_4_ - 0.0) + 0.0;
      auVar9 = maxps(ZEXT816(0),auVar9);
      auVar1._4_4_ = ((float)local_78._4_4_ - (float)local_58._0_4_) + 1.0;
      auVar1._0_4_ = ((float)local_78._0_4_ - pmVar3->minValue) + 1.0;
      auVar1._8_4_ = (fStack_70 - 0.0) + 0.0;
      auVar1._12_4_ = (fStack_6c - (float)local_58._4_4_) + 0.0;
      auVar9 = divps(auVar9,auVar1);
      pmVar3 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](attr_stats,&local_80);
      pmVar4 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](attr_stats,&local_7c);
      fVar6 = pmVar4->maxValue;
      if (pmVar3->maxValue <= pmVar4->maxValue) {
        fVar6 = pmVar3->maxValue;
      }
      local_68 = ZEXT416((uint)fVar6);
      pmVar3 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](attr_stats,&local_80);
      pmVar4 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](attr_stats,&local_7c);
      fVar6 = pmVar4->minValue;
      if (pmVar3->minValue <= pmVar4->minValue) {
        fVar6 = pmVar3->minValue;
      }
      local_58._0_4_ = fVar6;
      local_98 = auVar9._0_4_;
      fStack_94 = auVar9._4_4_;
      if (fStack_94 <= local_98) {
        fStack_94 = local_98;
      }
      *numTuples = fStack_94 * *numTuples;
      pmVar3 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](attr_stats,&local_80);
      fVar6 = pmVar3->numTuples;
      pmVar3 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](attr_stats,&local_80);
      _local_78 = ZEXT416((uint)pmVar3->minValue);
      pmVar3 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](attr_stats,&local_80);
      local_48._0_16_ = ZEXT416((uint)pmVar3->maxValue);
      pmVar3 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](attr_stats,&local_80);
      fVar7 = (float)local_68._0_4_ - (float)local_78._0_4_;
      fVar8 = (float)local_48._0_4_ - pmVar3->minValue;
      pmVar3 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](attr_stats,&local_80);
      pmVar3->numTuples = (fVar6 * (fVar7 + 1.0)) / (fVar8 + 1.0);
      pmVar3 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](attr_stats,&local_80);
      fVar6 = pmVar3->numTuples;
      pmVar3 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](attr_stats,&local_7c);
      fVar7 = pmVar3->maxValue - (float)local_58._0_4_;
      pmVar3 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](attr_stats,&local_7c);
      local_78._0_4_ = pmVar3->maxValue;
      pmVar3 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](attr_stats,&local_7c);
      fVar8 = (float)local_78._0_4_ - pmVar3->minValue;
      pmVar3 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](attr_stats,&local_7c);
      pmVar3->numTuples = (fVar7 * fVar6) / (fVar8 + 1.0);
      pmVar3 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](attr_stats,&local_80);
      pmVar3->maxValue = (float)local_68._0_4_;
      pmVar3 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](attr_stats,&local_80);
      pmVar3->minValue = (float)local_58._0_4_;
      fVar6 = (float)local_58._0_4_;
    }
    NormalizeStats(pQVar5,attr_stats,fVar6,*numTuples,local_80,local_7c);
  }
  return RVar2;
}

Assistant:

RC QO_Manager::ApplyLTCond(map<int, attrStat> &attr_stats, int condIdx, float& numTuples){
  RC rc = 0;
  // Retrieves the indices of the condition attributes
  int idx, idx2;
  if((rc = CondToAttrIdx(condIdx, idx, idx2)))
    return (rc);
  float frac = 0.0;
  if(conds[condIdx].bRhsIsAttr){
    // calculate the "mid" value of the range of the two values
    float mid = 0.5*(min(attr_stats[idx].maxValue, attr_stats[idx2].maxValue) + 
      max(attr_stats[idx].minValue, attr_stats[idx2].minValue));
    // based on this mid value, calculate the estimated fraction of
    // tuples from each relation that passes the condition. 
    float fracS = max(attr_stats[idx2].maxValue - mid + 1, (float)0.0) / 
      (attr_stats[idx2].maxValue - attr_stats[idx2].minValue + 1);
    float fracR = max(mid - attr_stats[idx].minValue + 1, (float)0.0) / 
      (attr_stats[idx].maxValue - attr_stats[idx].minValue + 1);
    // calculate the new maxR and minS values
    float newMaxR = min(attr_stats[idx].maxValue, attr_stats[idx2].maxValue);
    float newMinS = min(attr_stats[idx].minValue, attr_stats[idx2].minValue);
    // the number of tuples, based on fracS and fracR calculated above
    numTuples = numTuples * max(fracR, fracS);
    // update the join attribute stats
    attr_stats[idx].numTuples = attr_stats[idx].numTuples*(newMaxR - attr_stats[idx].minValue + 1)/
      (attr_stats[idx].maxValue - attr_stats[idx].minValue + 1);
    attr_stats[idx2].numTuples = attr_stats[idx].numTuples*(attr_stats[idx2].maxValue - newMinS)/
      (attr_stats[idx2].maxValue - attr_stats[idx2].minValue + 1);
    attr_stats[idx].maxValue = newMaxR;
    attr_stats[idx].minValue = newMinS;
    frac = max(fracR, fracS);
  }
  else{
    float value;
    ConvertValueToFloat(condIdx, value); // get the max value
    // calculate the fraction of values expected to survive the condition. assume
    // that values for relation are evenly distributed
    float fracR = (value - attr_stats[idx].minValue + 1)/(attr_stats[idx].maxValue - attr_stats[idx].minValue + 2);
    // update values
    numTuples = numTuples*fracR;
    attr_stats[idx].numTuples = attr_stats[idx].numTuples * fracR;
    attr_stats[idx].maxValue = value;
    frac = fracR;
  }
  // Normalize non-join attributes
  NormalizeStats(attr_stats, frac, numTuples, idx, idx2);

  return (0);
}